

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O3

bool ON_PassesNanTest(void)

{
  double dVar1;
  ulong uVar2;
  char *sFormat;
  bool bVar3;
  int line_number;
  double local_48 [8];
  
  if (((ON_DBL_QNAN <= 1.0) ||
      (((ON_DBL_QNAN == 1.0 && (!NAN(ON_DBL_QNAN))) || (0.0 < ON_DBL_QNAN)))) ||
     (((ON_DBL_QNAN != 1.0 || (ON_DBL_QNAN < 0.0)) || (!NAN(ON_DBL_QNAN))))) {
    sFormat = 
    "This compiler does not conform to the IEEE-754 nan compare specification. Some opennurbs code will fail."
    ;
    bVar3 = false;
    line_number = 0xec;
  }
  else {
    local_48[0] = ON_DBL_QNAN + 1.0;
    local_48[1] = ON_DBL_QNAN + 1.0;
    local_48[2] = ON_DBL_QNAN + -1.0;
    local_48[3] = 1.0 - ON_DBL_QNAN;
    local_48[4] = ON_DBL_QNAN;
    local_48[5] = ON_DBL_QNAN;
    local_48[6] = ON_DBL_QNAN;
    local_48[7] = 1.0 / ON_DBL_QNAN;
    uVar2 = 0;
    do {
      dVar1 = local_48[uVar2];
      bVar3 = NAN(dVar1);
      if (6 < uVar2) break;
      uVar2 = uVar2 + 1;
    } while (NAN(dVar1));
    if (NAN(dVar1)) {
      return bVar3;
    }
    sFormat = 
    "This compiler does not conform to the IEEE-754 nan arithmetic specification. Some opennurbs code will fail."
    ;
    line_number = 0x101;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_math.cpp"
             ,line_number,"",sFormat);
  return bVar3;
}

Assistant:

bool ON_PassesNanTest()
{

  bool bPassesAllNanTests = false;
  for (;;)
  {
    const double nan1 = ON_DBL_QNAN;
    const double nan2 = ON_DBL_QNAN;
    const double zero = 0.0;
    const double one = 1.0;

    // nan != * and * != nan should always be true
    const bool b_NE_test
      = nan1 != nan1
      && nan1 != nan2
      && nan1 != zero
      && nan1 != one
      && zero != nan2
      && one != nan2
      ;

    // nan op * and * op nan when op is ==, < > <= >= should all be false
    const bool b_EQ_test
      = nan1 == nan1
      || nan1 == nan2
      || nan1 == zero
      || nan1 == one
      || zero == nan2
      || one == nan2
      ;

    const bool b_LT_test
      = nan1 < nan1
      || nan1 < nan2
      || nan1 < zero
      || nan1 < one
      || zero < nan2
      || one < nan2
      ;

    const bool b_GT_test
      = nan1 > nan1
      || nan1 > nan2
      || nan1 > zero
      || nan1 > one
      || zero > nan2
      || one > nan2
      ;

    const bool b_LE_test
      = nan1 <= nan1
      || nan1 <= nan2
      || nan1 <= zero
      || nan1 <= one
      || zero <= nan2
      || one <= nan2
      ;

    const bool b_GE_test
      = nan1 >= nan1
      || nan1 >= nan2
      || nan1 >= zero
      || nan1 >= one
      || zero >= nan2
      || one >= nan2
      ;

    const bool bPassesIEE754NanCompareTests
      = b_NE_test
      && false == b_EQ_test
      && false == b_LT_test
      && false == b_GT_test
      && false == b_LE_test
      && false == b_GE_test
      ;

    if (false == bPassesIEE754NanCompareTests)
    {
      // some opennurbs code will fail.
      ON_ERROR("This compiler does not conform to the IEEE-754 nan compare specification. Some opennurbs code will fail.");
      break;
    }

    const double x[] = {
      nan1 + one, one + nan1,
      nan1 - one, one - nan1,
      nan1 * one, one * nan1,
      nan1 / one, one / nan1
    };

    const size_t xcount = sizeof(x) / sizeof(x[0]);
    bool bPassesNanAritmeticTest = true;
    for (size_t i = 0; i < xcount && bPassesNanAritmeticTest; ++i)
    {
      bPassesNanAritmeticTest = x[i] != x[i];
    }

    if (false == bPassesNanAritmeticTest)
    {
      // some opennurbs code will fail.
      ON_ERROR("This compiler does not conform to the IEEE-754 nan arithmetic specification. Some opennurbs code will fail.");
      break;
    }

    bPassesAllNanTests = true;
    break;
  }


  return bPassesAllNanTests;
}